

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.h
# Opt level: O0

Expression __thiscall
dynet::AttentionalModel<dynet::LSTMBuilder>::BuildGraph
          (AttentionalModel<dynet::LSTMBuilder> *this,vector<int,_std::allocator<int>_> *source,
          vector<int,_std::allocator<int>_> *target,ComputationGraph *cg,Expression *alignment,
          vector<int,_std::allocator<int>_> *ctx,Expression *coverage,Expression *fertility)

{
  size_type sVar1;
  vector<int,_std::allocator<int>_> *in_RCX;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *this_00;
  Expression *x;
  undefined8 extraout_RDX;
  long in_RSI;
  ComputationGraph *in_RDI;
  undefined8 in_R8;
  long in_R9;
  Expression EVar2;
  long in_stack_00000010;
  long in_stack_00000018;
  RNNPointer *in_stack_000000a0;
  ComputationGraph *in_stack_000000a8;
  int in_stack_000000b0;
  int in_stack_000000b4;
  AttentionalModel<dynet::LSTMBuilder> *in_stack_000000b8;
  Expression partition;
  Expression exponent;
  Expression delta;
  Expression var_trim;
  Expression mu_trim;
  AttentionalModel<dynet::LSTMBuilder> *in_stack_00000150;
  Expression var;
  Expression mu;
  Expression fhid;
  Expression vbias;
  Expression mbias;
  Expression fbias;
  Expression i_penalty;
  Expression i_ones;
  Expression i_total_trim;
  Expression i_totals;
  Expression i_aligns;
  Expression i_err;
  Expression i_r_t;
  uint t;
  uint tlen;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> errs;
  Expression *i_nerr;
  Expression *in_stack_fffffffffffffbe8;
  Expression *in_stack_fffffffffffffbf0;
  value_type *in_stack_fffffffffffffbf8;
  allocator_type *__a;
  float y;
  value_type *in_stack_fffffffffffffc00;
  undefined1 *__n;
  AttentionalModel<dynet::LSTMBuilder> *in_stack_fffffffffffffc10;
  ComputationGraph *in_stack_fffffffffffffc48;
  VariableIndex in_stack_fffffffffffffc50;
  uint in_stack_fffffffffffffc54;
  ComputationGraph *in_stack_fffffffffffffc58;
  Expression local_398;
  expr local_388 [32];
  Expression local_368;
  Expression local_358;
  Expression local_348 [2];
  Expression local_328;
  Expression local_318;
  Expression local_308;
  Expression local_2f8;
  Expression local_2e8;
  Expression local_2d8;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined1 local_2b8 [16];
  Expression local_2a8;
  Expression local_298;
  Expression local_288;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined1 local_268 [16];
  Expression local_258;
  Expression local_248;
  undefined8 local_238;
  undefined8 uStack_230;
  Expression local_220;
  Expression local_210;
  Expression local_200;
  Expression local_1f0;
  Expression local_1e0;
  undefined1 local_1c9 [17];
  undefined1 local_1b8 [40];
  Expression local_190;
  allocator_type local_179;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined1 local_168 [40];
  Expression local_140;
  undefined1 local_129;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined1 local_118 [40];
  Expression local_f0;
  Expression local_e0 [2];
  Expression local_c0;
  Expression local_b0 [3];
  Expression local_80 [2];
  undefined1 local_60 [16];
  uint local_50;
  uint local_4c;
  long local_30;
  undefined8 local_28;
  vector<int,_std::allocator<int>_> *local_20;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  start_new_instance(in_stack_00000150,(vector<int,_std::allocator<int>_> *)mu_trim._8_8_,mu_trim.pg
                     ,(vector<int,_std::allocator<int>_> *)var_trim._8_8_);
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
            ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)0x199f33);
  sVar1 = std::vector<int,_std::allocator<int>_>::size(local_20);
  local_4c = (int)sVar1 - 1;
  for (local_50 = 0; local_50 < local_4c; local_50 = local_50 + 1) {
    std::vector<int,_std::allocator<int>_>::operator[](local_20,(ulong)local_50);
    add_input(in_stack_000000b8,in_stack_000000b4,in_stack_000000b0,in_stack_000000a8,
              in_stack_000000a0);
    std::vector<int,_std::allocator<int>_>::operator[](local_20,(ulong)(local_50 + 1));
    dynet::expr::pickneglogsoftmax(local_80,(uint)local_60);
    std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::push_back
              ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
               in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  }
  if (local_30 != 0) {
    expr::
    concatenate_cols<std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
              ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
               in_stack_fffffffffffffbe8);
    expr::Expression::operator=(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  }
  if ((in_stack_00000010 != 0) || (in_stack_00000018 != 0)) {
    if (local_30 == 0) {
      expr::
      concatenate_cols<std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
                ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                 in_stack_fffffffffffffbe8);
    }
    else {
      expr::Expression::Expression(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    }
    dynet::expr::sum_cols(local_b0);
    dynet::expr::pickrange(&local_c0,(uint)local_b0,1);
    if (in_stack_00000010 != 0) {
      auxiliary_vector(in_stack_fffffffffffffc10);
      repeat(in_stack_fffffffffffffc58,in_stack_fffffffffffffc54,(float)in_stack_fffffffffffffc50.t,
             (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffc48);
      dynet::expr::squared_distance(local_e0,&local_c0);
      expr::Expression::operator=(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    }
    if (in_stack_00000018 != 0) {
      if ((*(byte *)(in_RSI + 0x39d) & 1) == 0) {
        __assert_fail("global_fertility",
                      "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/src/attentional.h"
                      ,0x1c4,
                      "Expression dynet::AttentionalModel<dynet::LSTMBuilder>::BuildGraph(const std::vector<int> &, const std::vector<int> &, ComputationGraph &, Expression *, const std::vector<int> *, Expression *, Expression *) [Builder = dynet::LSTMBuilder]"
                     );
      }
      this_00 = (vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                (ulong)*(uint *)(in_RSI + 0x4bc);
      local_128 = *(undefined8 *)(in_RSI + 0xf8);
      uStack_120 = *(undefined8 *)(in_RSI + 0x100);
      dynet::expr::parameter(local_118,local_28,local_128,uStack_120);
      __n = &local_129;
      std::allocator<dynet::expr::Expression>::allocator
                ((allocator<dynet::expr::Expression> *)0x19a222);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
                (this_00,(size_type)__n,in_stack_fffffffffffffc00,
                 (allocator_type *)in_stack_fffffffffffffbf8);
      expr::
      concatenate_cols<std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
                ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                 in_stack_fffffffffffffbe8);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::~vector
                ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                 in_stack_fffffffffffffc00);
      std::allocator<dynet::expr::Expression>::~allocator
                ((allocator<dynet::expr::Expression> *)0x19a274);
      in_stack_fffffffffffffc00 = (value_type *)(ulong)*(uint *)(in_RSI + 0x4bc);
      local_178 = *(undefined8 *)(in_RSI + 0x108);
      uStack_170 = *(undefined8 *)(in_RSI + 0x110);
      dynet::expr::parameter(local_168,local_28,local_178,uStack_170);
      __a = &local_179;
      std::allocator<dynet::expr::Expression>::allocator
                ((allocator<dynet::expr::Expression> *)0x19a2ce);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
                (this_00,(size_type)__n,in_stack_fffffffffffffc00,__a);
      expr::
      concatenate<std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
                ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                 in_stack_fffffffffffffbe8);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::~vector
                ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                 in_stack_fffffffffffffc00);
      std::allocator<dynet::expr::Expression>::~allocator
                ((allocator<dynet::expr::Expression> *)0x19a320);
      x = (Expression *)(ulong)*(uint *)(in_RSI + 0x4bc);
      local_1c9._1_8_ = *(undefined8 *)(in_RSI + 0x118);
      local_1c9._9_8_ = *(undefined8 *)(in_RSI + 0x120);
      dynet::expr::parameter(local_1b8,local_28,local_1c9._1_8_,local_1c9._9_8_);
      in_stack_fffffffffffffbe8 = (Expression *)local_1c9;
      std::allocator<dynet::expr::Expression>::allocator
                ((allocator<dynet::expr::Expression> *)0x19a379);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
                (this_00,(size_type)__n,in_stack_fffffffffffffc00,__a);
      y = (float)((ulong)__a >> 0x20);
      expr::
      concatenate<std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
                ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                 in_stack_fffffffffffffbe8);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::~vector
                ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                 in_stack_fffffffffffffc00);
      std::allocator<dynet::expr::Expression>::~allocator
                ((allocator<dynet::expr::Expression> *)0x19a3ca);
      local_238 = *(undefined8 *)(in_RSI + 200);
      uStack_230 = *(undefined8 *)(in_RSI + 0xd0);
      dynet::expr::parameter(&local_220,local_28,local_238,uStack_230);
      dynet::expr::operator*(&local_210,&local_220);
      dynet::expr::operator+(&local_200,&local_f0);
      dynet::expr::transpose(&local_1f0);
      dynet::expr::tanh(&local_1e0);
      local_278 = *(undefined8 *)(in_RSI + 0xd8);
      uStack_270 = *(undefined8 *)(in_RSI + 0xe0);
      dynet::expr::parameter(local_268,local_28,local_278,uStack_270);
      dynet::expr::operator*(&local_258,&local_1e0);
      dynet::expr::operator+(&local_248,&local_140);
      local_2c8 = *(undefined8 *)(in_RSI + 0xe8);
      uStack_2c0 = *(undefined8 *)(in_RSI + 0xf0);
      dynet::expr::parameter(local_2b8,local_28,local_2c8,uStack_2c0);
      dynet::expr::operator*(&local_2a8,&local_1e0);
      dynet::expr::operator+(&local_298,&local_190);
      dynet::expr::exp(&local_288);
      dynet::expr::pickrange(&local_2d8,(uint)&local_248,1);
      dynet::expr::pickrange(&local_2e8,(uint)&local_288,1);
      dynet::expr::operator-(&local_2f8,&local_c0);
      dynet::expr::cmult(&local_328,&local_2f8);
      dynet::expr::operator-((expr *)&local_318,&local_328);
      expr::operator*(y,x);
      dynet::expr::cdiv(&local_308,&local_318);
      expr::operator*(y,x);
      dynet::expr::operator*(&local_368,3.1415927);
      dynet::expr::log(&local_358);
      expr::operator*(y,x);
      dynet::expr::operator+((Expression *)&stack0xfffffffffffffc48,local_348);
      dynet::expr::transpose((Expression *)&stack0xfffffffffffffc58);
      dynet::expr::sum_cols(&local_398);
      dynet::expr::operator-(local_388,&local_398);
      expr::Expression::operator=(x,in_stack_fffffffffffffbe8);
    }
  }
  expr::sum<std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
            ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
             in_stack_fffffffffffffbe8);
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::~vector
            ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
             in_stack_fffffffffffffc00);
  EVar2._8_8_ = extraout_RDX;
  EVar2.pg = in_RDI;
  return EVar2;
}

Assistant:

Expression AttentionalModel<Builder>::BuildGraph(const std::vector<int> &source,
        const std::vector<int>& target, ComputationGraph& cg, Expression *alignment,
        const std::vector<int>* ctx, Expression *coverage, Expression *fertility) 
{
    //std::cout << "source sentence length: " << source.size() << " target: " << target.size() << std::endl;
    start_new_instance(source, cg, ctx);

    std::vector<Expression> errs;
    const unsigned tlen = target.size() - 1; 
    for (unsigned t = 0; t < tlen; ++t) {
        Expression i_r_t = add_input(target[t], t, cg);
        Expression i_err = pickneglogsoftmax(i_r_t, target[t+1]);
        errs.push_back(i_err);
    }
    // save the alignment for later
    if (alignment != 0) {
	// pop off the last alignment column
        *alignment = concatenate_cols(aligns);
    }

    // AM paper (vision one) has a penalty over alignment rows deviating from 1
    if (coverage != nullptr || fertility != nullptr) {
        Expression i_aligns = (alignment != 0) ? *alignment : concatenate_cols(aligns);
        Expression i_totals = sum_cols(i_aligns);
        // only care about the non-null entries
        Expression i_total_trim = pickrange(i_totals, 1, slen-1);

        if (coverage != nullptr) {
            Expression i_ones = repeat(cg, slen-2, 1.0f, auxiliary_vector());
            Expression i_penalty = squared_distance(i_total_trim, i_ones);
            *coverage = i_penalty;
        } 

        if (fertility != nullptr) {
            assert(global_fertility);

            Expression fbias = concatenate_cols(std::vector<Expression>(slen, parameter(cg, p_bfhid)));
            Expression mbias = concatenate(std::vector<Expression>(slen, parameter(cg, p_bfmu)));
            Expression vbias = concatenate(std::vector<Expression>(slen, parameter(cg, p_bfvar)));
            Expression fhid = tanh(transpose(fbias + parameter(cg, p_Wfhid) * src));  
            Expression mu = mbias + fhid * parameter(cg, p_Wfmu);
            Expression var = exp(vbias + fhid * parameter(cg, p_Wfvar));

            Expression mu_trim = pickrange(mu, 1, slen-1);
            Expression var_trim = pickrange(var, 1, slen-1);

#if 0
            /* log-Normal distribution */
            Expression log_fert = log(i_total_trim);
            Expression delta = log_fert - mu_trim;
            Expression exponent = cdiv(-cmult(delta, delta), 2.0f * var_trim);
            Expression partition = -log_fert - 0.5 * log(2.0f * var_trim * 3.14159265359);
            *fertility = -sum_cols(transpose(partition + exponent));
#else
            /* Normal distribution */
            Expression delta = i_total_trim - mu_trim;
            Expression exponent = cdiv(-cmult(delta, delta), 2.0f * var_trim);
            Expression partition = -0.5 * log(2.0f * var_trim * 3.14159265359);
            *fertility = -sum_cols(transpose(partition + exponent));
            // note that as this is the value of the normal density, the errors
            // are not strictly positive
#endif

            //LOLCAT(transpose(i_total_trim));
            //LOLCAT(transpose(mu_trim));
            //LOLCAT(transpose(var_trim));
            //LOLCAT(transpose(partition + exponent));
            //LOLCAT(exp(transpose(partition + exponent)));
        }
    }

    Expression i_nerr = sum(errs);
    return i_nerr;
}